

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O2

void game_run(_func_void *eventpoll,_func_void *draw)

{
  vec2i vVar1;
  vec2i v;
  long lVar2;
  vec2i *pvVar3;
  int iVar4;
  int iVar5;
  cell_type cVar6;
  time_t tVar7;
  vec2i *pvVar8;
  long lVar9;
  char *__function;
  uint uVar10;
  uint uVar12;
  int local_58;
  ulong uVar11;
  ulong uVar13;
  
  local_58 = SDL_GetTicks();
  do {
    while (g.state != INIT) {
      if (g.state == QUIT) {
        game_quit();
        return;
      }
      (*eventpoll)();
      if (g.state != RUNNING) {
        if (g.state == MENU) {
          if (g.level < 3) {
            if (g.level < 0) {
              g.level = 2;
            }
          }
          else {
            g.level = 0;
          }
        }
        goto LAB_00102abe;
      }
      iVar4 = SDL_GetTicks();
      if ((force_update == '\0') && ((uint)(iVar4 - local_58) <= levels[g.level].update_ms))
      goto LAB_00102abe;
      force_update = '\0';
      vVar1 = g.snake.seg[(long)g.snake.len + -1];
      lVar9 = (long)g.snake.len + -1;
      while (pvVar3 = g.snake.seg, lVar9 != 0) {
        g.snake.seg[lVar9] = g.snake.seg[lVar9 + -1];
        lVar9 = lVar9 + -1;
      }
      pvVar8 = g.snake.seg;
      switch(g.dir) {
      case UP:
        iVar5 = -1;
        goto LAB_00102a01;
      case RIGHT:
        iVar5 = 1;
        break;
      case DOWN:
        iVar5 = 1;
LAB_00102a01:
        pvVar8 = (vec2i *)&(g.snake.seg)->y;
        break;
      case LEFT:
        iVar5 = -1;
        break;
      default:
        __function = "void game_update()";
        uVar10 = 0x60;
        goto LAB_00102b3b;
      }
      pvVar8->x = pvVar8->x + iVar5;
      v = *pvVar3;
      cVar6 = cell_gettype(v);
      local_58 = iVar4;
      if (cVar6 == WALL) {
        if (levels[g.level].wall_collisions == false) {
          iVar4 = v.x;
          if (iVar4 < 0 || ui_cols <= iVar4) {
            iVar4 = ui_cols + iVar4;
            pvVar3->x = iVar4;
            pvVar3->x = iVar4 % ui_cols;
          }
          if ((long)v < 0 || ui_rows <= v.y) {
            pvVar3->y = (v.y + ui_rows) % ui_rows;
          }
          cVar6 = cell_gettype(*pvVar3);
          goto LAB_00102a91;
        }
LAB_00102ab4:
        g.state = LOST;
      }
      else {
LAB_00102a91:
        if ((cVar6 == SNAKE) || ((cVar6 == WALL && ((levels[g.level].wall_collisions & 1U) != 0))))
        goto LAB_00102ab4;
        if (cVar6 == FOOD) {
          snake_push(vVar1);
          do {
            iVar4 = rand();
            lVar9 = (long)ui_cols;
            iVar5 = rand();
            lVar2 = (long)ui_rows;
            cVar6 = cell_gettype((vec2i)(((long)iVar4 % lVar9 & 0xffffffffU) +
                                        ((long)iVar5 % lVar2 << 0x20)));
          } while (cVar6 != EMPTY);
          g.food.x = (int32_t)((long)iVar4 % lVar9);
          g.food.y = (int32_t)((long)iVar5 % lVar2);
        }
      }
LAB_00102abe:
      (*draw)();
    }
    tVar7 = time((time_t *)0x0);
    srand((uint)tVar7);
    iVar4 = rand();
    g.dir = iVar4 % 4;
    iVar4 = rand();
    iVar4 = iVar4 % ui_cols;
    iVar5 = rand();
    g.food.y = iVar5 % ui_rows;
    g.snake.len = 0;
    g.food.x = iVar4;
    iVar4 = rand();
    uVar12 = ui_cols / 4 + iVar4 % (ui_cols / 2);
    uVar13 = (ulong)uVar12;
    iVar4 = rand();
    uVar10 = ui_rows / 4 + iVar4 % (ui_rows / 2);
    uVar11 = (ulong)uVar10;
    vVar1.y = uVar10;
    vVar1.x = uVar12;
    snake_push(vVar1);
    switch(g.dir) {
    case UP:
      uVar11 = (ulong)(uVar10 + 1);
      break;
    case RIGHT:
      uVar13 = (ulong)(uVar12 - 1);
      break;
    case DOWN:
      uVar11 = (ulong)(uVar10 - 1);
      break;
    case LEFT:
      uVar13 = (ulong)(uVar12 + 1);
      break;
    default:
      __function = "void game_init()";
      uVar10 = 0x4a;
LAB_00102b3b:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/game.c"
                    ,uVar10,__function);
    }
    snake_push((vec2i)(uVar13 | uVar11 << 0x20));
    g.state = MENU;
  } while( true );
}

Assistant:

void game_run(void (*eventpoll)(void), void (*draw)(void)) {
    uint32_t last_ticks = SDL_GetTicks();
    while (g.state != QUIT) {
        if (g.state == INIT) {
            game_init();
            continue;
        }
        
        eventpoll();

        if (g.state == MENU) {
            if ((signed int) g.level > nlevels-1)
                g.level = 0;
            else if ((signed int) g.level < 0)
                g.level = nlevels-1;
        } else if (g.state == RUNNING) {
            uint32_t now_ticks = SDL_GetTicks();
            if (force_update || now_ticks - last_ticks > levels[g.level].update_ms) {
                /* Update. */
                force_update = false;
                last_ticks = now_ticks;
                game_update();
            }
        }

        draw();
    }

    game_quit();
}